

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

_Bool skip_ws_delim(char **begin,char *end,char delim)

{
  _Bool _Var1;
  char *local_30;
  char *it;
  char *pcStack_20;
  char delim_local;
  char *end_local;
  char **begin_local;
  
  local_30 = *begin;
  if (((((local_30 < end) && (*local_30 != ' ')) && (*local_30 != '\t')) &&
      ((*local_30 != '\n' && (*local_30 != '\r')))) && (*local_30 != delim)) {
    begin_local._7_1_ = false;
  }
  else {
    it._7_1_ = delim;
    pcStack_20 = end;
    end_local = (char *)begin;
    _Var1 = skip_ws(&local_30,end);
    if ((_Var1) && (_Var1 = skip_delim(&local_30,pcStack_20,it._7_1_), _Var1)) {
      skip_ws(&local_30,pcStack_20);
    }
    *(char **)end_local = local_30;
    begin_local._7_1_ = local_30 < pcStack_20;
  }
  return begin_local._7_1_;
}

Assistant:

static inline bool skip_ws_delim(const char** begin, const char* end, char delim)
{
    const char* it = *begin;
    if(it < end && !IS_WS(*it) && *it != delim)
        return false;
    if(skip_ws(&it, end)) {
        if(skip_delim(&it, end, delim)) {
            skip_ws(&it, end);
        }
    }

    *begin = it;
    return it < end;
}